

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall Lowerer::CreateOpndForSlotAccess(Lowerer *this,Opnd *opnd)

{
  bool bVar1;
  IRType IVar2;
  int iVar3;
  SymOpnd *this_00;
  PropertySym *pPVar4;
  StackSym *pSVar5;
  StackSym *pSVar6;
  JITTimeFunctionBody *pJVar7;
  AsmJsJITInfo *this_01;
  RegOpnd *baseOpnd;
  IndirOpnd *indirOpnd;
  int32 offset;
  SymOpnd *closureSym;
  PropertySym *dstSym;
  SymOpnd *symOpnd;
  Opnd *opnd_local;
  Lowerer *this_local;
  
  this_00 = IR::Opnd::AsSymOpnd(opnd);
  pPVar4 = Sym::AsPropertySym(this_00->m_sym);
  bVar1 = Func::IsLoopBody(this->m_func);
  if (((bVar1) || (bVar1 = Func::DoStackFrameDisplay(this->m_func), !bVar1)) ||
     ((pSVar6 = pPVar4->m_stackSym, pSVar5 = Func::GetLocalClosureSym(this->m_func),
      pSVar6 != pSVar5 &&
      (pSVar6 = pPVar4->m_stackSym, pSVar5 = Func::GetLocalFrameDisplaySym(this->m_func),
      pSVar6 != pSVar5)))) {
    indirOpnd._4_4_ = pPVar4->m_propertyId;
    pJVar7 = Func::GetJITFunctionBody(this->m_func);
    bVar1 = JITTimeFunctionBody::IsAsmJsMode(pJVar7);
    if (!bVar1) {
      IVar2 = IR::Opnd::GetType(opnd);
      indirOpnd._4_4_ = indirOpnd._4_4_ * TySize[IVar2];
    }
    bVar1 = Func::IsTJLoopBody(this->m_func);
    if (bVar1) {
      pJVar7 = Func::GetJITFunctionBody(this->m_func);
      this_01 = JITTimeFunctionBody::GetAsmJsInfo(pJVar7);
      iVar3 = AsmJsJITInfo::GetTotalSizeInBytes(this_01);
      indirOpnd._4_4_ = indirOpnd._4_4_ - iVar3;
    }
    baseOpnd = IR::SymOpnd::CreatePropertyOwnerOpnd(this_00,this->m_func);
    IVar2 = IR::Opnd::GetType(opnd);
    this_local = (Lowerer *)IR::IndirOpnd::New(baseOpnd,indirOpnd._4_4_,IVar2,this->m_func,false);
  }
  else {
    this_local = (Lowerer *)IR::SymOpnd::New(&pPVar4->m_stackSym->super_Sym,0,TyInt64,this->m_func);
    pSVar6 = IR::Opnd::GetStackSym((Opnd *)this_local);
    *(uint *)&pSVar6->field_0x18 = *(uint *)&pSVar6->field_0x18 & 0xefffffff | 0x10000000;
  }
  return (Opnd *)this_local;
}

Assistant:

IR::Opnd *
Lowerer::CreateOpndForSlotAccess(IR::Opnd * opnd)
{
    IR::SymOpnd * symOpnd = opnd->AsSymOpnd();
    PropertySym * dstSym = symOpnd->m_sym->AsPropertySym();

    if (!m_func->IsLoopBody() &&
        m_func->DoStackFrameDisplay() &&
        (dstSym->m_stackSym == m_func->GetLocalClosureSym() || dstSym->m_stackSym == m_func->GetLocalFrameDisplaySym()))
    {
        // Stack closure syms are made to look like slot accesses for the benefit of GlobOpt, so that it can do proper
        // copy prop and implicit call bailout. But what we really want is local stack load/store.
        // Don't do this for loop body, though, since we don't have the value saved on the stack.
        IR::SymOpnd * closureSym = IR::SymOpnd::New(dstSym->m_stackSym, 0, TyMachReg, this->m_func);
        closureSym->GetStackSym()->m_isClosureSym = true;
        return closureSym;
    }

    int32 offset = dstSym->m_propertyId;
    if (!m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        offset = offset * TySize[opnd->GetType()];
    }
#ifdef ASMJS_PLAT
    if (m_func->IsTJLoopBody())
    {
        offset = offset - m_func->GetJITFunctionBody()->GetAsmJsInfo()->GetTotalSizeInBytes();
    }
#endif

    IR::IndirOpnd *indirOpnd = IR::IndirOpnd::New(symOpnd->CreatePropertyOwnerOpnd(m_func),
       offset , opnd->GetType(), this->m_func);
    return indirOpnd;
}